

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int equation_system_init(aom_equation_system_t *eqns,int n)

{
  double *pdVar1;
  uint in_ESI;
  aom_equation_system_t *in_RDI;
  int local_4;
  
  pdVar1 = (double *)aom_malloc(0x3a3654);
  in_RDI->A = pdVar1;
  pdVar1 = (double *)aom_malloc(0x3a366d);
  in_RDI->b = pdVar1;
  pdVar1 = (double *)aom_malloc(0x3a3687);
  in_RDI->x = pdVar1;
  in_RDI->n = in_ESI;
  if (((in_RDI->A == (double *)0x0) || (in_RDI->b == (double *)0x0)) || (in_RDI->x == (double *)0x0)
     ) {
    fprintf(_stderr,"Failed to allocate system of equations of size %d\n",(ulong)in_ESI);
    aom_free(in_RDI);
    aom_free(in_RDI);
    aom_free(in_RDI);
    memset(in_RDI,0,0x20);
    local_4 = 0;
  }
  else {
    equation_system_clear(in_RDI);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int equation_system_init(aom_equation_system_t *eqns, int n) {
  eqns->A = (double *)aom_malloc(sizeof(*eqns->A) * n * n);
  eqns->b = (double *)aom_malloc(sizeof(*eqns->b) * n);
  eqns->x = (double *)aom_malloc(sizeof(*eqns->x) * n);
  eqns->n = n;
  if (!eqns->A || !eqns->b || !eqns->x) {
    fprintf(stderr, "Failed to allocate system of equations of size %d\n", n);
    aom_free(eqns->A);
    aom_free(eqns->b);
    aom_free(eqns->x);
    memset(eqns, 0, sizeof(*eqns));
    return 0;
  }
  equation_system_clear(eqns);
  return 1;
}